

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O0

void Dec_GraphUpdateNetwork(Abc_Obj_t *pRoot,Dec_Graph_t *pGraph,int fUpdateLevel,int nGain)

{
  Abc_Ntk_t *pNtk_00;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNew;
  int nNodesOld;
  int nNodesNew;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pRootNew;
  int nGain_local;
  int fUpdateLevel_local;
  Dec_Graph_t *pGraph_local;
  Abc_Obj_t *pRoot_local;
  
  pNtk_00 = pRoot->pNtk;
  iVar1 = Abc_NtkNodeNum(pNtk_00);
  pNew = Dec_GraphToNetwork(pNtk_00,pGraph);
  Abc_AigReplace((Abc_Aig_t *)pNtk_00->pManFunc,pRoot,pNew,fUpdateLevel);
  iVar2 = Abc_NtkNodeNum(pNtk_00);
  if (nGain <= iVar1 - iVar2) {
    return;
  }
  __assert_fail("nGain <= nNodesOld - nNodesNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/dec/decAbc.c"
                ,0xfd,"void Dec_GraphUpdateNetwork(Abc_Obj_t *, Dec_Graph_t *, int, int)");
}

Assistant:

void Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain )
{
    extern Abc_Obj_t *    Dec_GraphToNetwork( Abc_Ntk_t * pNtk, Dec_Graph_t * pGraph );
    Abc_Obj_t * pRootNew;
    Abc_Ntk_t * pNtk = pRoot->pNtk;
    int nNodesNew, nNodesOld;
    nNodesOld = Abc_NtkNodeNum(pNtk);
    // create the new structure of nodes
    pRootNew = Dec_GraphToNetwork( pNtk, pGraph );
    // remove the old nodes
    Abc_AigReplace( (Abc_Aig_t *)pNtk->pManFunc, pRoot, pRootNew, fUpdateLevel );
    // compare the gains
    nNodesNew = Abc_NtkNodeNum(pNtk);
    assert( nGain <= nNodesOld - nNodesNew );
}